

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShaderResourceVariableBase.hpp
# Opt level: O1

void __thiscall
Diligent::ShaderVariableManagerBase<Diligent::EngineVkImplTraits,_Diligent::ShaderVariableVkImpl>::
CheckResources(ShaderVariableManagerBase<Diligent::EngineVkImplTraits,_Diligent::ShaderVariableVkImpl>
               *this,IResourceMapping *pResourceMapping,BIND_SHADER_RESOURCES_FLAGS Flags,
              SHADER_RESOURCE_VARIABLE_TYPE_FLAGS *StaleVarTypes)

{
  uint uVar1;
  BIND_SHADER_RESOURCES_FLAGS Flags_00;
  long lVar2;
  ulong uVar3;
  
  Flags_00 = Flags | BIND_SHADER_RESOURCES_UPDATE_ALL;
  if ((Flags & BIND_SHADER_RESOURCES_UPDATE_ALL) != 0) {
    Flags_00 = Flags;
  }
  if (*(int *)&this[1].m_Owner != 0) {
    uVar1 = *(uint *)&this->m_ResourceCache->field_0x1c;
    lVar2 = 0;
    uVar3 = 0;
    do {
      if ((*StaleVarTypes | ((int)~uVar1 >> 0x1f) * -5 - SHADER_RESOURCE_VARIABLE_TYPE_FLAG_ALL) ==
          ~SHADER_RESOURCE_VARIABLE_TYPE_FLAG_NONE) {
        return;
      }
      ShaderVariableBase<Diligent::ShaderVariableVkImpl,_Diligent::ShaderVariableManagerVk,_Diligent::IShaderResourceVariable>
      ::CheckResources((ShaderVariableBase<Diligent::ShaderVariableVkImpl,_Diligent::ShaderVariableManagerVk,_Diligent::IShaderResourceVariable>
                        *)((long)&(this->m_pVariables->
                                  super_ShaderVariableBase<Diligent::ShaderVariableVkImpl,_Diligent::ShaderVariableManagerVk,_Diligent::IShaderResourceVariable>
                                  ).super_IShaderResourceVariable.super_IObject._vptr_IObject +
                          lVar2),pResourceMapping,Flags_00,StaleVarTypes);
      uVar3 = uVar3 + 1;
      lVar2 = lVar2 + 0x18;
    } while (uVar3 < *(uint *)&this[1].m_Owner);
  }
  return;
}

Assistant:

void CheckResources(IResourceMapping*                    pResourceMapping,
                        BIND_SHADER_RESOURCES_FLAGS          Flags,
                        SHADER_RESOURCE_VARIABLE_TYPE_FLAGS& StaleVarTypes) const
    {
        if ((Flags & BIND_SHADER_RESOURCES_UPDATE_ALL) == 0)
            Flags |= BIND_SHADER_RESOURCES_UPDATE_ALL;

        const ThisImplType*                       pThis        = static_cast<const ThisImplType*>(this);
        const SHADER_RESOURCE_VARIABLE_TYPE_FLAGS AllowedTypes = m_ResourceCache.GetContentType() == ResourceCacheContentType::SRB ?
            SHADER_RESOURCE_VARIABLE_TYPE_FLAG_MUT_DYN :
            SHADER_RESOURCE_VARIABLE_TYPE_FLAG_STATIC;
        for (Uint32 v = 0; (v < pThis->m_NumVariables) && (StaleVarTypes & AllowedTypes) != AllowedTypes; ++v)
        {
            m_pVariables[v].CheckResources(pResourceMapping, Flags, StaleVarTypes);
        }
    }